

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  TokenKind TVar1;
  Node *pNVar2;
  Token *pTVar3;
  Document *pDVar4;
  Twine TStack_68;
  Token local_50;
  
  if (this->Value != (Node *)0x0) {
    return this->Value;
  }
  pNVar2 = getKey(this);
  (*pNVar2->_vptr_Node[1])(pNVar2);
  pDVar4 = (((this->super_Node).Doc)->_M_t).
           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  if (*(char *)(*(long *)&pDVar4->stream->scanner + 0x4a) != '\x01') {
    pTVar3 = Node::peekNext(&this->super_Node);
    TVar1 = pTVar3->Kind;
    if (TVar1 < TK_Scalar) {
      if ((0x18901U >> (TVar1 & (TK_Key|TK_FlowMappingEnd)) & 1) == 0) {
        if (TVar1 != TK_Value) goto LAB_001ad413;
        Node::getNext(&local_50,&this->super_Node);
        std::__cxx11::string::_M_dispose();
        pTVar3 = Node::peekNext(&this->super_Node);
        if ((pTVar3->Kind != TK_Key) && (pTVar3->Kind != TK_BlockEnd)) {
          pNVar2 = Node::parseBlockNode(&this->super_Node);
          goto LAB_001ad3c5;
        }
      }
    }
    else {
LAB_001ad413:
      Twine::Twine(&TStack_68,"Unexpected token in Key Value.");
      Node::setError(&this->super_Node,&TStack_68,pTVar3);
    }
    pDVar4 = (((this->super_Node).Doc)->_M_t).
             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  }
  pNVar2 = (Node *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             (&pDVar4->NodeAllocator,0x48,0x10);
  NullNode::NullNode((NullNode *)pNVar2,(this->super_Node).Doc);
LAB_001ad3c5:
  this->Value = pNVar2;
  return pNVar2;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;
  getKey()->skip();
  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}